

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elg.c
# Opt level: O3

void i2p_elg_keygen(i2p_elg *elg)

{
  BN_CTX *ctx;
  BIGNUM *ret;
  BIGNUM *a;
  BIGNUM *ret_00;
  
  RAND_bytes(elg->priv,0x100);
  ctx = BN_CTX_new();
  ret = BN_new();
  a = BN_new();
  ret_00 = BN_new();
  BN_bin2bn(elgp_,0x100,ret_00);
  BN_set_word(a,2);
  BN_bin2bn(elg->priv,0x100,ret);
  BN_mod_exp(ret,a,ret,ret_00,ctx);
  bn2buf((BIGNUM *)ret,elg->pub,0x100);
  BN_free(ret);
  BN_free(a);
  BN_free(ret_00);
  BN_CTX_free(ctx);
  return;
}

Assistant:

void i2p_elg_keygen(struct i2p_elg * elg)
{
 
  RAND_bytes (elg->priv, 256);
  BN_CTX * ctx = BN_CTX_new ();
  BIGNUM * p = BN_new ();
  BIGNUM * elgg = BN_new ();
  BIGNUM * elgp = BN_new ();
  BN_bin2bn (elgp_, 256, elgp);
  BN_set_word(elgg, elgg_);
  BN_bin2bn (elg->priv, 256, p);
  BN_mod_exp (p, elgg, p, elgp, ctx);
  bn2buf (p, elg->pub, 256);
  BN_free (p);
  BN_free (elgg);
  BN_free (elgp);
  BN_CTX_free (ctx);
}